

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cc
# Opt level: O0

Int64 * iqxmlrpc::Value::get_default_int64(void)

{
  bool bVar1;
  reference_type t;
  Scalar<long> *local_48;
  
  bVar1 = boost::optional<long>::operator!((optional<long> *)ValueOptions::default_int64);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    local_48 = (Scalar<long> *)0x0;
  }
  else {
    local_48 = (Scalar<long> *)operator_new(0x10);
    t = boost::optional<long>::operator*((optional<long> *)ValueOptions::default_int64);
    Scalar<long>::Scalar(local_48,t);
  }
  return local_48;
}

Assistant:

Int64* Value::get_default_int64()
{
  return ValueOptions::default_int64 ? new Int64(*ValueOptions::default_int64) : 0;
}